

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O2

void __thiscall
chrono::ChIntegrableIIorder::StateScatter
          (ChIntegrableIIorder *this,ChState *y,double T,bool full_update)

{
  int iVar1;
  int n;
  ChStateDelta mv;
  ChState mx;
  ChStateDelta local_88;
  ChState local_70;
  Type local_58;
  
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])();
  ChState::ChState(&local_70,(long)iVar1,y->integrable);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  ChStateDelta::ChStateDelta(&local_88,(long)iVar1,y->integrable);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)y,0,iVar1);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_70.super_ChVectorDynamic<double>,
             &local_58.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x12])(this);
  n = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)y,(long)iVar1,n);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_88.super_ChVectorDynamic<double>,
             &local_58.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x17])(T,this,&local_70,&local_88,full_update);
  Eigen::internal::handmade_aligned_free
            (local_88.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_70.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChIntegrableIIorder::StateScatter(const ChState& y, const double T, bool full_update) {
    ChState mx(GetNcoords_x(), y.GetIntegrable());
    ChStateDelta mv(GetNcoords_v(), y.GetIntegrable());
    mx = y.segment(0, GetNcoords_x());
    mv = y.segment(GetNcoords_x(), GetNcoords_v());
    StateScatter(mx, mv, T, full_update);
}